

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O0

void __thiscall
NaParams::NaParams(NaParams *this,char *szFileName,int argc,char **argv,char *szSpecChar)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 *puVar3;
  char *pcVar4;
  ulong uVar5;
  item_t *piVar6;
  char **ppcVar7;
  size_t sVar8;
  _func_int **pp_Var9;
  long in_RCX;
  int in_EDX;
  char *in_RSI;
  NaParams *in_RDI;
  char *in_R8;
  bool bVar10;
  char **value_ref_1;
  int i;
  char **value_ref;
  char szAbsent [8];
  char *value;
  char *name;
  char *p;
  char *szFile;
  char *szExt;
  char *szPath;
  FILE *fp;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  NaParams *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char local_68 [8];
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  FILE *local_30;
  long local_20;
  int local_14;
  char *local_10;
  
  in_RDI->_vptr_NaParams = (_func_int **)&PTR__NaParams_00197c50;
  if (in_R8 == (char *)0x0) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0;
    __cxa_throw(puVar3,&NaException::typeinfo,0);
  }
  in_RDI->spec[0] = *in_R8;
  in_RDI->spec[1] = in_R8[1];
  in_RDI->stored_n = 0;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (in_RSI != (char *)0x0) {
    local_38 = strdup(in_RSI);
    local_40 = strstr(local_38,".par");
    if ((local_40 != (char *)0x0) && (local_40[4] == '\0')) {
      NaCloseLogFile();
      strcpy(local_40,".log");
      local_48 = strrchr(local_38,0x2f);
      if (local_48 == (char *)0x0) {
        local_48 = local_38 + -1;
      }
      NaOpenLogFile((char *)0x174980);
    }
    free(local_38);
    local_30 = fopen(local_10,"rb");
    if (local_30 == (FILE *)0x0) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 5;
      __cxa_throw(puVar3,&NaException::typeinfo,0);
    }
    while (pcVar4 = fgets(in_RDI->buf,0x3ff,local_30), pcVar4 != (char *)0x0) {
      local_50 = in_RDI->buf;
      if ((in_RDI->stored_n == 0) && (iVar2 = strncmp(local_50,anon_var_dwarf_2fe6,3), iVar2 == 0))
      {
        local_50 = local_50 + 3;
      }
      while( true ) {
        iVar2 = isspace((int)*local_50);
        bVar10 = false;
        if (iVar2 != 0) {
          bVar10 = *local_50 != '\0';
        }
        if (!bVar10) break;
        local_50 = local_50 + 1;
      }
      if ((*local_50 != '\0') && (*local_50 != in_RDI->spec[0])) {
        in_RDI->stored_n = in_RDI->stored_n + 1;
      }
      in_stack_ffffffffffffff77 = 0;
    }
    rewind(local_30);
  }
  if ((0 < local_14) && (local_20 != 0)) {
    in_RDI->stored_n = local_14 + in_RDI->stored_n;
  }
  if (in_RDI->stored_n == 0) {
    NaPrintLog("File \'%s\' does not contain parameters.\n",local_10);
    in_RDI->storage = (item_t *)0x0;
  }
  else {
    builtin_strncpy(local_68,"?absent",8);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)in_RDI->stored_n;
    uVar5 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    piVar6 = (item_t *)operator_new__(uVar5);
    in_RDI->storage = piVar6;
    in_RDI->stored_n = 0;
LAB_00174b81:
    pcVar4 = fgets(in_RDI->buf,0x3ff,local_30);
    if (pcVar4 != (char *)0x0) {
      bVar10 = parse_line((NaParams *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          (char *)in_stack_ffffffffffffff80,(char **)in_RDI,
                          (char **)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      if (!bVar10) goto code_r0x00174bc6;
      goto LAB_00174bdb;
    }
    for (iVar2 = 0; iVar2 < local_14; iVar2 = iVar2 + 1) {
      bVar10 = parse_line((NaParams *)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                          (char *)in_stack_ffffffffffffff80,(char **)in_RDI,
                          (char **)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      if (bVar10) {
LAB_00174dd1:
        NaPrintLog("cmd.line: name=\'%s\' value=\'%s\' ",local_58,local_60);
        bVar10 = CheckParam(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff77,
                                                    in_stack_ffffffffffffff70));
        if (bVar10) {
          in_stack_ffffffffffffff80 =
               (NaParams *)FetchParam(in_stack_ffffffffffffff80,(char *)in_RDI);
          if (in_stack_ffffffffffffff80->_vptr_NaParams != (_func_int **)0x0) {
            operator_delete__(in_stack_ffffffffffffff80->_vptr_NaParams);
          }
          sVar8 = strlen(local_60);
          pp_Var9 = (_func_int **)operator_new__(sVar8 + 1);
          in_stack_ffffffffffffff80->_vptr_NaParams = pp_Var9;
          strcpy((char *)in_stack_ffffffffffffff80->_vptr_NaParams,local_60);
          NaPrintLog("REPLACE\n");
        }
        else {
          sVar8 = strlen(local_58);
          pcVar4 = (char *)operator_new__(sVar8 + 1);
          in_RDI->storage[in_RDI->stored_n].name = pcVar4;
          strcpy(in_RDI->storage[in_RDI->stored_n].name,local_58);
          sVar8 = strlen(local_60);
          pcVar4 = (char *)operator_new__(sVar8 + 1);
          in_RDI->storage[in_RDI->stored_n].value = pcVar4;
          strcpy(in_RDI->storage[in_RDI->stored_n].value,local_60);
          in_RDI->stored_n = in_RDI->stored_n + 1;
          qsort(in_RDI->storage,(long)in_RDI->stored_n,0x10,stored_cmp);
          NaPrintLog("APPEND\n");
        }
      }
      else if (local_58 != (char *)0x0) {
        local_60 = local_68;
        goto LAB_00174dd1;
      }
    }
  }
  fclose(local_30);
  qsort(in_RDI->storage,(long)in_RDI->stored_n,0x10,stored_cmp);
  return;
code_r0x00174bc6:
  if (local_58 != (char *)0x0) {
    local_60 = local_68;
LAB_00174bdb:
    NaPrintLog("name=\'%s\' value=\'%s\' ",local_58,local_60);
    bVar10 = CheckParam(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)
                       );
    if (bVar10) {
      ppcVar7 = FetchParam(in_stack_ffffffffffffff80,(char *)in_RDI);
      if (*ppcVar7 != (char *)0x0) {
        operator_delete__(*ppcVar7);
      }
      sVar8 = strlen(local_60);
      pcVar4 = (char *)operator_new__(sVar8 + 1);
      *ppcVar7 = pcVar4;
      strcpy(*ppcVar7,local_60);
      NaPrintLog("REPLACE\n");
    }
    else {
      sVar8 = strlen(local_58);
      pcVar4 = (char *)operator_new__(sVar8 + 1);
      in_RDI->storage[in_RDI->stored_n].name = pcVar4;
      strcpy(in_RDI->storage[in_RDI->stored_n].name,local_58);
      sVar8 = strlen(local_60);
      pcVar4 = (char *)operator_new__(sVar8 + 1);
      in_RDI->storage[in_RDI->stored_n].value = pcVar4;
      strcpy(in_RDI->storage[in_RDI->stored_n].value,local_60);
      in_RDI->stored_n = in_RDI->stored_n + 1;
      qsort(in_RDI->storage,(long)in_RDI->stored_n,0x10,stored_cmp);
      NaPrintLog("APPEND\n");
    }
  }
  goto LAB_00174b81;
}

Assistant:

NaParams::NaParams (const char* szFileName,
		    /* Extra values in format argv[i]=" name = value " */
		    int argc, char** argv,
		    const char szSpecChar[2])
{
  if(NULL == szSpecChar)
    throw(na_null_pointer);

  spec[COMMENT] = szSpecChar[COMMENT];
  spec[ASSIGN] = szSpecChar[ASSIGN];

  FILE	*fp;
  stored_n = 0;

  if(NULL != szFileName)
    {
      // open special logfile derived from name of parameter
      char	*szPath = strdup(szFileName);
      char	*szExt = strstr(szPath, ".par");
      if(NULL != szExt && szExt[4] == '\0')
	{
	  // let's replace log file with new one but in current directory
	  NaCloseLogFile();
	  strcpy(szExt, ".log");
	  char	*szFile = strrchr(szPath, '/');
	  if(NULL == szFile)
	    /* local already */
	    szFile = szPath - 1;
	  NaOpenLogFile(szFile + 1);
	}
      free(szPath);

      // open file
      fp = fopen(szFileName, "rb"); // rt
      if(NULL == fp)
	throw(na_cant_open_file);

      // read file to get high estimation for number of lines in it
      while(NULL != fgets(buf, NaPARAM_LINE_MAX_LEN, fp))
	{
	  // skip leading spaces
	  char	*p;

	  p = buf;

	  if(0 == stored_n &&
	     !strncmp(p, NaBOM_utf8, strlen(NaBOM_utf8))){
	      // BOM is found -> it's OK
	      p += strlen(NaBOM_utf8);
	  }

	  // skip leading spaces before name
	  while(isspace(*p) && *p != '\0')
	    ++p;
	  if(*p != '\0' && *p != spec[COMMENT])
	    // non-empty line
	    ++stored_n;
	  // else
	  //   no name in this line due to empty line
	}

      // rewind file
      rewind(fp);
    }

  if(argc > 0 && argv != NULL)
    {
      // add lines for additional arguments in command line
      stored_n += argc;
    }

  // allocate storage
  if(0 == stored_n)
    {
      NaPrintLog("File '%s' does not contain parameters.\n",
		 szFileName);
      storage = NULL;
    }
  else
    {
      char	*name, *value;
      char	szAbsent[] = "?absent";
      storage = new item_t[stored_n];

      //int	item_i = 0;
      stored_n = 0;

      // read file to the storage
      while(NULL != fgets(buf, NaPARAM_LINE_MAX_LEN, fp))
	{
	  // parse line of text
	  if(!parse_line(buf, name, value))
	    {
	      if(NULL == name)
		// comment line
		continue;
	      // empty value
	      value = szAbsent;
	    }

	  NaPrintLog("name='%s' value='%s' ", name, value);

	  if(CheckParam(name))
	    {
	      // already exist -> replace value
	      char*&	value_ref = FetchParam(name);
	      delete[] value_ref;

	      value_ref = new char[strlen(value) + 1];
	      strcpy(value_ref, value);

	      NaPrintLog("REPLACE\n");
	    }
	  else
	    {
	      // not exist
	      storage[stored_n].name = new char[strlen(name) + 1];
	      strcpy(storage[stored_n].name, name);

	      storage[stored_n].value = new char[strlen(value) + 1];
	      strcpy(storage[stored_n].value, value);

	      // go to next command line argument and next item
	      ++stored_n;

	      // quick sort the storage to have proper order
	      qsort(storage, stored_n, sizeof(item_t), stored_cmp);

	      NaPrintLog("APPEND\n");
	    }
	}

      // parse additional arguments from command line
      int	i;
      for(i = 0; i < argc; ++i)
	{
	  // parse command line argument
	  if(!parse_line(argv[i], name, value))
	    {
	      if(NULL == name)
		// comment line
		continue;
	      // empty value
	      value = szAbsent;
	    }

	  NaPrintLog("cmd.line: name='%s' value='%s' ", name, value);

	  if(CheckParam(name))
	    {
	      // already exist -> replace value
	      char*&	value_ref = FetchParam(name);
	      delete[] value_ref;

	      value_ref = new char[strlen(value) + 1];
	      strcpy(value_ref, value);

	      NaPrintLog("REPLACE\n");
	    }
	  else
	    {
	      // not exist
	      storage[stored_n].name = new char[strlen(name) + 1];
	      strcpy(storage[stored_n].name, name);

	      storage[stored_n].value = new char[strlen(value) + 1];
	      strcpy(storage[stored_n].value, value);

	      // go to next command line argument and next item
	      ++stored_n;

	      // quick sort the storage to have proper order
	      qsort(storage, stored_n, sizeof(item_t), stored_cmp);

	      NaPrintLog("APPEND\n");
	    }
	}

      //stored_n = item_i;
    }

  fclose(fp);

  // quick sort the storage
  qsort(storage, stored_n, sizeof(item_t), stored_cmp);
}